

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  uint16_t *puVar6;
  BrotliDictionary *pBVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  uint uVar27;
  ushort uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  int *piVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  ulong local_160;
  ulong local_158;
  int local_144;
  size_t local_140;
  ulong local_130;
  ulong local_120;
  ulong local_118;
  ulong local_108;
  ulong local_f0;
  Command *local_c0;
  ulong local_b0;
  
  iVar22 = params->lgwin;
  uVar13 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar13 = position;
  }
  lVar37 = 0x200;
  if (params->quality < 9) {
    lVar37 = 0x40;
  }
  local_140 = *last_insert_len;
  iVar11 = *dist_cache;
  iVar5 = dist_cache[1];
  dist_cache[4] = iVar11 + -1;
  dist_cache[5] = iVar11 + 1;
  dist_cache[6] = iVar11 + -2;
  dist_cache[7] = iVar11 + 2;
  dist_cache[8] = iVar11 + -3;
  dist_cache[9] = iVar11 + 3;
  dist_cache[10] = iVar5 + -1;
  dist_cache[0xb] = iVar5 + 1;
  dist_cache[0xc] = iVar5 + -2;
  dist_cache[0xd] = iVar5 + 2;
  dist_cache[0xe] = iVar5 + -3;
  dist_cache[0xf] = iVar5 + 3;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 4) {
    local_c0 = commands;
LAB_0010a1f1:
    *last_insert_len = (local_140 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_c0 - (long)commands >> 4);
    return;
  }
  uVar29 = (1L << ((byte)iVar22 & 0x3f)) - 0x10;
  local_b0 = lVar37 + position;
  lVar3 = position - 1;
  local_c0 = commands;
  uVar17 = position;
LAB_00108eb8:
  local_118 = uVar1 - uVar17;
  uVar16 = uVar29;
  if (uVar17 < uVar29) {
    uVar16 = uVar17;
  }
  uVar24 = (params->dist).max_distance;
  uVar20 = uVar17 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar20);
  uVar27 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0x11;
  uVar26 = (ulong)((uint)local_118 & 7);
  local_160 = 0x7e4;
  local_130 = 0;
  lVar35 = 0;
  local_120 = 0;
  local_158 = 0;
  local_f0 = 0x7e4;
  do {
    uVar38 = (ulong)dist_cache[lVar35];
    uVar21 = uVar17 - uVar38;
    if ((((lVar35 == 0) || (hasher[(uVar21 & 0xffff) + 0x30028] == (uint8_t)uVar27)) &&
        (uVar38 <= uVar16)) && (uVar21 < uVar17)) {
      if (7 < local_118) {
        lVar40 = 0;
        uVar14 = 0;
LAB_00108f9d:
        if (*(ulong *)(piVar2 + uVar14 * 2) ==
            *(ulong *)(ringbuffer + uVar14 * 8 + (uVar21 & ringbuffer_mask))) goto code_r0x00108faf;
        uVar14 = *(ulong *)(ringbuffer + uVar14 * 8 + (uVar21 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar14 * 2);
        uVar21 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar14 = (uVar21 >> 3 & 0x1fffffff) - lVar40;
        goto LAB_00108fec;
      }
      uVar23 = 0;
      piVar41 = piVar2;
LAB_00109052:
      uVar14 = uVar23;
      if (uVar26 != 0) {
        uVar30 = uVar26 | uVar23;
        uVar15 = uVar26;
        do {
          uVar14 = uVar23;
          if (ringbuffer[uVar23 + (uVar21 & ringbuffer_mask)] != (uint8_t)*piVar41) break;
          piVar41 = (int *)((long)piVar41 + 1);
          uVar23 = uVar23 + 1;
          uVar15 = uVar15 - 1;
          uVar14 = uVar30;
        } while (uVar15 != 0);
      }
LAB_00108fec:
      if ((1 < uVar14) && (uVar21 = uVar14 * 0x87 + 0x78f, local_160 < uVar21)) {
        if (lVar35 != 0) {
          uVar21 = uVar21 - ((0x1ca10U >> ((byte)lVar35 & 0xe) & 0xe) + 0x27);
        }
        if (local_160 < uVar21) {
          local_130 = uVar14;
          local_f0 = uVar21;
          local_120 = uVar14;
          local_160 = uVar21;
          local_158 = uVar38;
        }
      }
    }
    lVar35 = lVar35 + 1;
  } while (lVar35 != 0x10);
  uVar38 = (ulong)uVar27;
  uVar34 = uVar27 & 0x1ff;
  lVar35 = *(long *)(hasher + 0x140428);
  uVar23 = uVar17 - *(uint *)(hasher + uVar38 * 4 + 0x28);
  uVar28 = *(ushort *)(hasher + uVar38 * 2 + 0x20028);
  uVar21 = (ulong)uVar28;
  uVar14 = (ulong)((uint)local_118 & 7);
  uVar15 = 0;
  uVar26 = uVar23;
  do {
    bVar46 = lVar35 == 0;
    lVar35 = lVar35 + -1;
    if (bVar46) break;
    uVar15 = uVar15 + uVar26;
    uVar30 = local_120;
    uVar31 = local_f0;
    uVar33 = local_160;
    uVar36 = local_158;
    uVar39 = local_130;
    if (uVar15 <= uVar16) {
      uVar43 = (ulong)*(ushort *)(hasher + uVar21 * 4 + (ulong)(uVar34 << 0xb) + 0x4002a);
      uVar26 = (ulong)*(ushort *)(hasher + uVar21 * 4 + (ulong)(uVar34 << 0xb) + 0x40028);
      uVar21 = uVar43;
      if (local_130 + uVar20 <= ringbuffer_mask) {
        uVar31 = uVar17 - uVar15 & ringbuffer_mask;
        if ((uVar31 + local_130 <= ringbuffer_mask) &&
           (ringbuffer[local_130 + uVar20] == ringbuffer[uVar31 + local_130])) {
          if (7 < local_118) {
            lVar40 = 0;
            uVar30 = 0;
LAB_00109186:
            if (*(ulong *)(piVar2 + uVar30 * 2) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar31))
            goto code_r0x00109198;
            uVar31 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar31) ^ *(ulong *)(piVar2 + uVar30 * 2);
            uVar30 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar40;
            goto LAB_001091c7;
          }
          piVar41 = piVar2;
          uVar33 = 0;
LAB_00109229:
          uVar30 = uVar33;
          if (uVar14 != 0) {
            uVar39 = uVar14 | uVar33;
            uVar36 = uVar14;
            do {
              uVar30 = uVar33;
              if (ringbuffer[uVar33 + uVar31] != (uint8_t)*piVar41) break;
              piVar41 = (int *)((long)piVar41 + 1);
              uVar33 = uVar33 + 1;
              uVar36 = uVar36 - 1;
              uVar30 = uVar39;
            } while (uVar36 != 0);
          }
LAB_001091c7:
          if (3 < uVar30) {
            iVar22 = 0x1f;
            if ((uint)uVar15 != 0) {
              for (; (uint)uVar15 >> iVar22 == 0; iVar22 = iVar22 + -1) {
              }
            }
            uVar31 = (ulong)(iVar22 * -0x1e + 0x780) + uVar30 * 0x87;
            uVar33 = uVar31;
            uVar36 = uVar15;
            uVar39 = uVar30;
            if (local_160 < uVar31) goto LAB_0010920e;
          }
        }
        uVar30 = local_120;
        uVar31 = local_f0;
        uVar33 = local_160;
        uVar36 = local_158;
        uVar39 = local_130;
      }
    }
LAB_0010920e:
    local_130 = uVar39;
    local_158 = uVar36;
    local_160 = uVar33;
    local_f0 = uVar31;
    local_120 = uVar30;
  } while (uVar15 <= uVar16);
  uVar4 = *(ushort *)(hasher + (ulong)uVar34 * 2 + 0x140028);
  *(ushort *)(hasher + (ulong)uVar34 * 2 + 0x140028) = uVar4 + 1;
  uVar19 = uVar4 & 0x1ff;
  hasher[(uVar17 & 0xffff) + 0x30028] = (uint8_t)uVar27;
  if (0xfffe < uVar23) {
    uVar23 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar19 * 4 + (ulong)(uVar34 << 0xb) + 0x40028) = (short)uVar23;
  *(ushort *)(hasher + (ulong)uVar19 * 4 + (ulong)(uVar34 << 0xb) + 0x4002a) = uVar28;
  *(int *)(hasher + uVar38 * 4 + 0x28) = (int)uVar17;
  *(short *)(hasher + uVar38 * 2 + 0x20028) = (short)uVar19;
  if (local_f0 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar20 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar6 = (params->dictionary).hash_table;
      lVar35 = *(long *)(hasher + 0x18);
      local_144 = 0;
      lVar40 = 0;
LAB_00109b61:
      uVar28 = puVar6[uVar20];
      lVar35 = lVar35 + 1;
      *(long *)(hasher + 0x18) = lVar35;
      if ((ulong)uVar28 != 0) {
        uVar27 = uVar28 & 0x1f;
        uVar26 = (ulong)uVar27;
        bVar46 = true;
        if (uVar26 <= local_118) {
          pBVar7 = (params->dictionary).words;
          puVar25 = pBVar7->data + (ulong)pBVar7->offsets_by_length[uVar26] + uVar26 * (uVar28 >> 5)
          ;
          if (7 < uVar26) {
            uVar38 = (ulong)(uVar28 & 0x18);
            lVar42 = 0;
            uVar21 = 0;
LAB_00109bc6:
            if (*(ulong *)(puVar25 + uVar21 * 8) == *(ulong *)(piVar2 + uVar21 * 2))
            goto code_r0x00109bd8;
            uVar38 = *(ulong *)(piVar2 + uVar21 * 2) ^ *(ulong *)(puVar25 + uVar21 * 8);
            uVar21 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = (uVar21 >> 3 & 0x1fffffff) - lVar42;
            goto LAB_00109c1e;
          }
          uVar38 = 0;
          goto LAB_00109ce1;
        }
        goto LAB_00109c6a;
      }
      goto LAB_00109c7d;
    }
    local_144 = 0;
  }
  else {
    local_144 = 0;
  }
LAB_0010932d:
  if (0x7e4 < local_f0) {
    lVar35 = *(long *)(hasher + 0x140428);
    uVar16 = (lVar3 + num_bytes) - uVar17;
    iVar22 = 0;
LAB_00109361:
    local_118 = local_118 - 1;
    uVar24 = local_120 - 1;
    if (local_118 <= local_120 - 1) {
      uVar24 = local_118;
    }
    if (4 < params->quality) {
      uVar24 = 0;
    }
    uVar20 = uVar17 + 1;
    uVar26 = uVar29;
    if (uVar20 < uVar29) {
      uVar26 = uVar20;
    }
    uVar21 = (params->dist).max_distance;
    uVar15 = uVar20 & ringbuffer_mask;
    piVar2 = (int *)(ringbuffer + uVar15);
    uVar27 = (uint)(*(int *)(ringbuffer + uVar15) * 0x1e35a7bd) >> 0x11;
    uVar23 = (ulong)((uint)local_118 & 7);
    local_130 = 0x7e4;
    lVar40 = 0;
    uVar38 = 0;
    local_108 = 0;
    uVar14 = 0x7e4;
LAB_00109400:
    uVar31 = (ulong)dist_cache[lVar40];
    uVar30 = uVar20 - uVar31;
    if (((lVar40 == 0) || (hasher[(uVar30 & 0xffff) + 0x30028] == (uint8_t)uVar27)) &&
       ((uVar31 <= uVar26 && (uVar30 < uVar20)))) {
      uVar33 = uVar23;
      if (7 < local_118) {
        lVar42 = 0;
        uVar36 = 0;
LAB_00109450:
        if (*(ulong *)(piVar2 + uVar36 * 2) ==
            *(ulong *)(ringbuffer + uVar36 * 8 + (uVar30 & ringbuffer_mask))) goto code_r0x00109462;
        uVar33 = *(ulong *)(ringbuffer + uVar36 * 8 + (uVar30 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar36 * 2);
        uVar30 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar36 = (uVar30 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_00109491;
      }
      uVar36 = 0;
      piVar41 = piVar2;
      goto joined_r0x0010950c;
    }
    goto LAB_001094f2;
  }
  local_140 = local_140 + 1;
  position = uVar17 + 1;
  if (local_b0 < position) {
    if ((uint)((int)lVar37 * 4) + local_b0 < position) {
      uVar16 = uVar17 + 0x11;
      if (uVar1 - 4 <= uVar17 + 0x11) {
        uVar16 = uVar1 - 4;
      }
      for (; position < uVar16; position = position + 4) {
        uVar27 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar17 = (ulong)uVar27;
        uVar19 = uVar27 & 0x1ff;
        uVar28 = *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028);
        *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028) = uVar28 + 1;
        uVar34 = uVar28 & 0x1ff;
        uVar24 = position - *(uint *)(hasher + uVar17 * 4 + 0x28);
        if (0xfffe < uVar24) {
          uVar24 = 0xffff;
        }
        hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar27;
        *(short *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x40028) = (short)uVar24;
        *(undefined2 *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x4002a) =
             *(undefined2 *)(hasher + uVar17 * 2 + 0x20028);
        *(int *)(hasher + uVar17 * 4 + 0x28) = (int)position;
        *(short *)(hasher + uVar17 * 2 + 0x20028) = (short)uVar34;
        local_140 = local_140 + 4;
      }
    }
    else {
      uVar16 = uVar17 + 9;
      if (uVar1 - 3 <= uVar17 + 9) {
        uVar16 = uVar1 - 3;
      }
      for (; position < uVar16; position = position + 2) {
        uVar27 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar17 = (ulong)uVar27;
        uVar19 = uVar27 & 0x1ff;
        uVar28 = *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028);
        *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028) = uVar28 + 1;
        uVar34 = uVar28 & 0x1ff;
        uVar24 = position - *(uint *)(hasher + uVar17 * 4 + 0x28);
        if (0xfffe < uVar24) {
          uVar24 = 0xffff;
        }
        hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar27;
        *(short *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x40028) = (short)uVar24;
        *(undefined2 *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x4002a) =
             *(undefined2 *)(hasher + uVar17 * 2 + 0x20028);
        *(int *)(hasher + uVar17 * 4 + 0x28) = (int)position;
        *(short *)(hasher + uVar17 * 2 + 0x20028) = (short)uVar34;
        local_140 = local_140 + 2;
      }
    }
  }
  goto LAB_0010a1a6;
code_r0x00108faf:
  uVar14 = uVar14 + 1;
  lVar40 = lVar40 + -8;
  uVar23 = local_118 & 0xfffffffffffffff8;
  piVar41 = (int *)((long)piVar2 + (local_118 & 0xfffffffffffffff8));
  if (local_118 >> 3 == uVar14) goto LAB_00109052;
  goto LAB_00108f9d;
code_r0x00109198:
  uVar30 = uVar30 + 1;
  lVar40 = lVar40 + -8;
  piVar41 = (int *)(ringbuffer + (local_118 & 0xfffffffffffffff8) + uVar20);
  uVar33 = local_118 & 0xfffffffffffffff8;
  if (local_118 >> 3 == uVar30) goto LAB_00109229;
  goto LAB_00109186;
code_r0x00109bd8:
  uVar21 = uVar21 + 1;
  lVar42 = lVar42 + -8;
  if (uVar27 >> 3 == uVar21) goto code_r0x00109be4;
  goto LAB_00109bc6;
code_r0x00109be4:
  puVar25 = puVar25 + -lVar42;
LAB_00109ce1:
  uVar14 = (ulong)uVar28 & 7;
  uVar21 = uVar38;
  if ((uVar28 & 7) != 0) {
    uVar23 = uVar38 | uVar14;
    do {
      uVar21 = uVar38;
      if (*(uint8_t *)((long)piVar2 + uVar38) != *puVar25) break;
      puVar25 = puVar25 + 1;
      uVar38 = uVar38 + 1;
      uVar14 = uVar14 - 1;
      uVar21 = uVar23;
    } while (uVar14 != 0);
  }
LAB_00109c1e:
  if (((uVar21 == 0) || ((params->dictionary).cutoffTransformsCount + uVar21 <= uVar26)) ||
     (uVar26 = (ulong)(uVar28 >> 5) + uVar16 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar26 - uVar21) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar26 - uVar21) * 4 << (pBVar7->size_bits_by_length[uVar26] & 0x3f)),
     uVar24 < uVar26)) {
    bVar46 = true;
  }
  else {
    iVar22 = 0x1f;
    if ((uint)uVar26 != 0) {
      for (; (uint)uVar26 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar38 = (uVar21 * 0x87 - (ulong)(uint)(iVar22 * 0x1e)) + 0x780;
    bVar46 = true;
    if (local_f0 <= uVar38) {
      local_144 = uVar27 - (int)uVar21;
      bVar46 = false;
      local_158 = uVar26;
      local_120 = uVar21;
      local_f0 = uVar38;
    }
  }
LAB_00109c6a:
  if (!bVar46) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_00109c7d:
  uVar20 = uVar20 + 1;
  bVar46 = lVar40 != 0;
  lVar40 = lVar40 + 1;
  if (bVar46) goto LAB_0010932d;
  goto LAB_00109b61;
code_r0x00109462:
  uVar36 = uVar36 + 1;
  lVar42 = lVar42 + -8;
  if (uVar16 >> 3 == uVar36) goto code_r0x00109470;
  goto LAB_00109450;
code_r0x00109470:
  uVar36 = -lVar42;
  piVar41 = (int *)((long)piVar2 - lVar42);
joined_r0x0010950c:
  for (; (uVar33 != 0 && (ringbuffer[uVar36 + (uVar30 & ringbuffer_mask)] == (uint8_t)*piVar41));
      uVar36 = uVar36 + 1) {
    uVar33 = uVar33 - 1;
    piVar41 = (int *)((long)piVar41 + 1);
  }
LAB_00109491:
  if ((1 < uVar36) && (uVar30 = uVar36 * 0x87 + 0x78f, local_130 < uVar30)) {
    if (lVar40 != 0) {
      uVar30 = uVar30 - ((0x1ca10U >> ((byte)lVar40 & 0xe) & 0xe) + 0x27);
    }
    if (local_130 < uVar30) {
      uVar24 = uVar36;
      uVar38 = uVar36;
      uVar14 = uVar30;
      local_130 = uVar30;
      local_108 = uVar31;
    }
  }
LAB_001094f2:
  lVar40 = lVar40 + 1;
  if (lVar40 == 0x10) goto LAB_0010952e;
  goto LAB_00109400;
LAB_0010952e:
  uVar33 = (ulong)uVar27;
  uVar34 = uVar27 & 0x1ff;
  uVar36 = uVar20 - *(uint *)(hasher + uVar33 * 4 + 0x28);
  uVar28 = *(ushort *)(hasher + uVar33 * 2 + 0x20028);
  uVar30 = (ulong)uVar28;
  uVar31 = (ulong)((uint)local_118 & 7);
  uVar39 = 0;
  uVar23 = uVar36;
  lVar40 = lVar35;
LAB_00109582:
  bVar46 = lVar40 != 0;
  lVar40 = lVar40 + -1;
  if (bVar46) {
    uVar39 = uVar39 + uVar23;
    uVar43 = uVar24;
    uVar44 = uVar38;
    uVar45 = uVar14;
    uVar9 = local_130;
    uVar10 = local_108;
    if (uVar39 <= uVar26) {
      lVar42 = uVar30 * 4;
      uVar23 = (ulong)*(ushort *)(hasher + uVar30 * 4 + (ulong)(uVar34 << 0xb) + 0x40028);
      uVar30 = (ulong)*(ushort *)(hasher + lVar42 + (ulong)(uVar34 << 0xb) + 0x4002a);
      if (uVar24 + uVar15 <= ringbuffer_mask) {
        uVar44 = uVar20 - uVar39 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar44 + uVar24) ||
           (ringbuffer[uVar24 + uVar15] != ringbuffer[uVar44 + uVar24])) goto LAB_00109681;
        uVar45 = uVar31;
        if (7 < local_118) {
          lVar32 = 0;
          uVar43 = 0;
LAB_00109604:
          if (*(ulong *)(piVar2 + uVar43 * 2) == *(ulong *)(ringbuffer + uVar43 * 8 + uVar44))
          goto code_r0x00109616;
          uVar44 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar44) ^ *(ulong *)(piVar2 + uVar43 * 2);
          uVar43 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
            }
          }
          uVar43 = (uVar43 >> 3 & 0x1fffffff) - lVar32;
          goto LAB_0010964c;
        }
        uVar43 = 0;
        piVar41 = piVar2;
        goto joined_r0x001096b0;
      }
      goto LAB_00109681;
    }
    goto LAB_00109687;
  }
  goto LAB_001096f4;
code_r0x00109616:
  uVar43 = uVar43 + 1;
  lVar32 = lVar32 + -8;
  if (uVar16 >> 3 == uVar43) goto code_r0x00109624;
  goto LAB_00109604;
code_r0x00109624:
  uVar43 = -lVar32;
  piVar41 = (int *)((long)piVar2 - lVar32);
joined_r0x001096b0:
  for (; (uVar45 != 0 && (ringbuffer[uVar43 + uVar44] == (uint8_t)*piVar41)); uVar43 = uVar43 + 1) {
    uVar45 = uVar45 - 1;
    piVar41 = (int *)((long)piVar41 + 1);
  }
LAB_0010964c:
  if (3 < uVar43) {
    iVar11 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar11 == 0; iVar11 = iVar11 + -1) {
      }
    }
    uVar45 = (ulong)(iVar11 * -0x1e + 0x780) + uVar43 * 0x87;
    uVar44 = uVar43;
    uVar9 = uVar45;
    uVar10 = uVar39;
    if (local_130 < uVar45) goto LAB_00109687;
  }
LAB_00109681:
  uVar43 = uVar24;
  uVar44 = uVar38;
  uVar45 = uVar14;
  uVar9 = local_130;
  uVar10 = local_108;
LAB_00109687:
  local_108 = uVar10;
  local_130 = uVar9;
  uVar14 = uVar45;
  uVar38 = uVar44;
  uVar24 = uVar43;
  if (uVar26 < uVar39) goto LAB_001096f4;
  goto LAB_00109582;
LAB_001096f4:
  uVar4 = *(ushort *)(hasher + (ulong)uVar34 * 2 + 0x140028);
  *(ushort *)(hasher + (ulong)uVar34 * 2 + 0x140028) = uVar4 + 1;
  uVar19 = uVar4 & 0x1ff;
  hasher[(uVar20 & 0xffff) + 0x30028] = (uint8_t)uVar27;
  if (0xfffe < uVar36) {
    uVar36 = 0xffff;
  }
  *(short *)(hasher + (ulong)uVar19 * 4 + (ulong)(uVar34 << 0xb) + 0x40028) = (short)uVar36;
  *(ushort *)(hasher + (ulong)uVar19 * 4 + (ulong)(uVar34 << 0xb) + 0x4002a) = uVar28;
  *(int *)(hasher + uVar33 * 4 + 0x28) = (int)uVar20;
  *(short *)(hasher + uVar33 * 2 + 0x20028) = (short)uVar19;
  if (uVar14 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar24 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar6 = (params->dictionary).hash_table;
      lVar40 = *(long *)(hasher + 0x18);
      iVar11 = 0;
      lVar42 = 0;
LAB_00109817:
      uVar28 = puVar6[uVar24];
      lVar40 = lVar40 + 1;
      *(long *)(hasher + 0x18) = lVar40;
      if ((ulong)uVar28 != 0) {
        uVar27 = uVar28 & 0x1f;
        uVar23 = (ulong)uVar27;
        bVar46 = true;
        if (uVar23 <= local_118) {
          pBVar7 = (params->dictionary).words;
          puVar25 = pBVar7->data + (ulong)pBVar7->offsets_by_length[uVar23] + uVar23 * (uVar28 >> 5)
          ;
          if (7 < uVar23) {
            uVar15 = (ulong)(uVar28 & 0x18);
            lVar32 = 0;
            uVar30 = 0;
LAB_00109898:
            if (*(ulong *)(puVar25 + uVar30 * 8) == *(ulong *)(piVar2 + uVar30 * 2))
            goto code_r0x001098ab;
            uVar30 = *(ulong *)(piVar2 + uVar30 * 2) ^ *(ulong *)(puVar25 + uVar30 * 8);
            uVar15 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar30 = (uVar15 >> 3 & 0x1fffffff) - lVar32;
            goto LAB_001098eb;
          }
          uVar15 = 0;
          goto LAB_00109980;
        }
        goto LAB_00109836;
      }
      goto LAB_00109842;
    }
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
  }
LAB_00109795:
  bVar46 = local_f0 + 0xaf <= uVar14;
  local_b0 = uVar17;
  iVar5 = iVar22;
  if (bVar46) {
    local_140 = local_140 + 1;
    local_158 = local_108;
    local_b0 = uVar20;
    local_144 = iVar11;
    local_120 = uVar38;
    local_f0 = uVar14;
    iVar5 = iVar22 + 1;
  }
  bVar8 = 2 < iVar22;
  uVar24 = uVar17 + 5;
  uVar16 = uVar16 - 1;
  uVar17 = local_b0;
  iVar22 = iVar5;
  if (!bVar46 || (bVar8 || uVar1 <= uVar24)) goto code_r0x001099fd;
  goto LAB_00109361;
code_r0x001098ab:
  uVar30 = uVar30 + 1;
  lVar32 = lVar32 + -8;
  if (uVar27 >> 3 == uVar30) goto code_r0x001098b7;
  goto LAB_00109898;
code_r0x001098b7:
  puVar25 = puVar25 + -lVar32;
LAB_00109980:
  uVar31 = (ulong)uVar28 & 7;
  uVar30 = uVar15;
  if ((uVar28 & 7) != 0) {
    uVar33 = uVar15 | uVar31;
    do {
      uVar30 = uVar15;
      if (*(uint8_t *)((long)piVar2 + uVar15) != *puVar25) break;
      puVar25 = puVar25 + 1;
      uVar15 = uVar15 + 1;
      uVar31 = uVar31 - 1;
      uVar30 = uVar33;
    } while (uVar31 != 0);
  }
LAB_001098eb:
  bVar8 = true;
  bVar46 = true;
  if (((uVar30 != 0) &&
      (bVar46 = bVar8, uVar23 < (params->dictionary).cutoffTransformsCount + uVar30)) &&
     (uVar23 = (ulong)(uVar28 >> 5) + uVar26 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar23 - uVar30) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar23 - uVar30) * 4 << (pBVar7->size_bits_by_length[uVar23] & 0x3f)),
     uVar23 <= uVar21)) {
    iVar5 = 0x1f;
    if ((uint)uVar23 != 0) {
      for (; (uint)uVar23 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar15 = (uVar30 * 0x87 - (ulong)(uint)(iVar5 * 0x1e)) + 0x780;
    if (uVar14 <= uVar15) {
      iVar11 = uVar27 - (int)uVar30;
      bVar46 = false;
      uVar38 = uVar30;
      uVar14 = uVar15;
      local_108 = uVar23;
    }
  }
LAB_00109836:
  if (!bVar46) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_00109842:
  uVar24 = uVar24 + 1;
  bVar46 = lVar42 != 0;
  lVar42 = lVar42 + 1;
  if (bVar46) goto LAB_00109795;
  goto LAB_00109817;
code_r0x001099fd:
  uVar17 = uVar29;
  if (local_b0 < uVar29) {
    uVar17 = local_b0;
  }
  if (local_158 <= uVar17) {
    uVar27 = 0;
    bVar46 = false;
    if (local_158 != (long)*dist_cache) {
      if (local_158 == (long)dist_cache[1]) {
        uVar27 = 1;
      }
      else {
        uVar16 = (local_158 + 3) - (long)*dist_cache;
        if (uVar16 < 7) {
          bVar18 = (byte)((int)uVar16 << 2);
          uVar27 = 0x9750468;
        }
        else {
          uVar16 = (local_158 + 3) - (long)dist_cache[1];
          if (6 < uVar16) {
            if (local_158 != (long)dist_cache[2]) {
              bVar46 = local_158 != (long)dist_cache[3];
              uVar27 = 3;
              goto LAB_00109e16;
            }
            uVar27 = 2;
            goto LAB_00109e14;
          }
          bVar18 = (byte)((int)uVar16 << 2);
          uVar27 = 0xfdb1ace;
        }
        uVar27 = uVar27 >> (bVar18 & 0x1f) & 0xf;
      }
LAB_00109e14:
      bVar46 = false;
    }
LAB_00109e16:
    if (!bVar46) {
      uVar16 = (ulong)uVar27;
      goto LAB_00109e27;
    }
  }
  uVar16 = local_158 + 0xf;
LAB_00109e27:
  if ((local_158 <= uVar17) && (uVar16 != 0)) {
    *(undefined8 *)(dist_cache + 2) = *(undefined8 *)(dist_cache + 1);
    iVar22 = *dist_cache;
    dist_cache[1] = iVar22;
    iVar11 = (int)local_158;
    *dist_cache = iVar11;
    dist_cache[4] = iVar11 + -1;
    dist_cache[5] = iVar11 + 1;
    dist_cache[6] = iVar11 + -2;
    dist_cache[7] = iVar11 + 2;
    dist_cache[8] = iVar11 + -3;
    dist_cache[9] = iVar11 + 3;
    dist_cache[10] = iVar22 + -1;
    dist_cache[0xb] = iVar22 + 1;
    dist_cache[0xc] = iVar22 + -2;
    dist_cache[0xd] = iVar22 + 2;
    dist_cache[0xe] = iVar22 + -3;
    dist_cache[0xf] = iVar22 + 3;
  }
  uVar27 = (uint)local_140;
  local_c0->insert_len_ = uVar27;
  local_c0->copy_len_ = local_144 << 0x19 | (uint)local_120;
  uVar24 = (ulong)(params->dist).num_direct_distance_codes;
  uVar17 = uVar24 + 0x10;
  if (uVar16 < uVar17) {
    local_c0->dist_prefix_ = (uint16_t)uVar16;
    uVar12 = 0;
  }
  else {
    uVar12 = (params->dist).distance_postfix_bits;
    bVar18 = (byte)uVar12;
    uVar16 = ((uVar16 - uVar24) + (4L << (bVar18 & 0x3f))) - 0x10;
    uVar34 = 0x1f;
    if ((uint)uVar16 != 0) {
      for (; (uint)uVar16 >> uVar34 == 0; uVar34 = uVar34 - 1) {
      }
    }
    uVar34 = (uVar34 ^ 0xffffffe0) + 0x1f;
    bVar46 = (uVar16 >> ((ulong)uVar34 & 0x3f) & 1) != 0;
    iVar22 = uVar34 - uVar12;
    local_c0->dist_prefix_ =
         (short)((uint)bVar46 + iVar22 * 2 + 0xfffe << (bVar18 & 0x3f)) +
         (short)uVar17 + (~(ushort)(-1 << (bVar18 & 0x1f)) & (ushort)uVar16) | (short)iVar22 * 0x400
    ;
    uVar12 = (uint32_t)(uVar16 - ((ulong)bVar46 + 2 << ((byte)uVar34 & 0x3f)) >> (bVar18 & 0x3f));
  }
  local_c0->dist_extra_ = uVar12;
  if (5 < local_140) {
    if (local_140 < 0x82) {
      uVar27 = 0x1f;
      uVar34 = (uint)(local_140 - 2);
      if (uVar34 != 0) {
        for (; uVar34 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = (int)(local_140 - 2 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar27 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_140 < 0x842) {
      uVar34 = 0x1f;
      if (uVar27 - 0x42 != 0) {
        for (; uVar27 - 0x42 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar27 = (uVar34 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar27 = 0x15;
      if (0x1841 < local_140) {
        uVar27 = (uint)(ushort)(0x17 - (local_140 < 0x5842));
      }
    }
  }
  uVar34 = local_144 + (uint)local_120;
  if (uVar34 < 10) {
    uVar19 = uVar34 - 2;
  }
  else if (uVar34 < 0x86) {
    uVar34 = uVar34 - 6;
    uVar19 = 0x1f;
    if (uVar34 != 0) {
      for (; uVar34 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar19 = (int)((ulong)(long)(int)uVar34 >> ((char)(uVar19 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar19 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar19 = 0x17;
    if (uVar34 < 0x846) {
      uVar19 = 0x1f;
      if (uVar34 - 0x46 != 0) {
        for (; uVar34 - 0x46 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar19 = (uVar19 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar19;
  uVar28 = (uVar4 & 7) + ((ushort)uVar27 & 7) * 8;
  if ((((local_c0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar27 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar28 = uVar28 | 0x40;
    }
  }
  else {
    iVar22 = ((uVar27 & 0xffff) >> 3) * 3 + ((uVar19 & 0xffff) >> 3);
    uVar28 = uVar28 + ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar22 * 0x40 + 0x40;
  }
  local_c0->cmd_prefix_ = uVar28;
  *num_literals = *num_literals + local_140;
  position = local_b0 + local_120;
  uVar17 = uVar13;
  if (position < uVar13) {
    uVar17 = position;
  }
  uVar16 = local_b0 + 2;
  if (local_158 < local_120 >> 2) {
    uVar24 = position + local_158 * -4;
    if (uVar24 < uVar16) {
      uVar24 = uVar16;
    }
    uVar16 = uVar24;
    if (uVar17 < uVar24) {
      uVar16 = uVar17;
    }
  }
  local_b0 = lVar37 + local_120 * 2 + local_b0;
  local_c0 = local_c0 + 1;
  if (uVar16 < uVar17) {
    do {
      uVar27 = (uint)(*(int *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar24 = (ulong)uVar27;
      uVar19 = uVar27 & 0x1ff;
      uVar28 = *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028);
      *(ushort *)(hasher + (ulong)uVar19 * 2 + 0x140028) = uVar28 + 1;
      uVar34 = uVar28 & 0x1ff;
      uVar20 = uVar16 - *(uint *)(hasher + uVar24 * 4 + 0x28);
      hasher[(uVar16 & 0xffff) + 0x30028] = (uint8_t)uVar27;
      if (0xfffe < uVar20) {
        uVar20 = 0xffff;
      }
      *(short *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x40028) = (short)uVar20;
      *(undefined2 *)(hasher + (ulong)uVar34 * 4 + (ulong)(uVar19 << 0xb) + 0x4002a) =
           *(undefined2 *)(hasher + uVar24 * 2 + 0x20028);
      *(int *)(hasher + uVar24 * 4 + 0x28) = (int)uVar16;
      *(short *)(hasher + uVar24 * 2 + 0x20028) = (short)uVar34;
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  local_140 = 0;
LAB_0010a1a6:
  uVar17 = position;
  if (uVar1 <= position + 4) goto LAB_0010a1f1;
  goto LAB_00108eb8;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}